

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O0

Status __thiscall
osqp::OsqpSolver::Init(OsqpSolver *this,OsqpInstance *instance,OsqpSettings *settings)

{
  string_view right_name;
  string_view right_name_00;
  string_view right_name_01;
  string_view right_name_02;
  string_view right_name_03;
  int iVar1;
  bool bVar2;
  Index IVar3;
  Index IVar4;
  StorageIndex *pSVar5;
  OSQPWorkspace **workp;
  c_int cVar6;
  OsqpSettings *in_RCX;
  TriangularView<const_Eigen::SparseMatrix<double,_0,_long_long>,_2U> TVar7;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view message_08;
  OSQPSettings *in_stack_fffffffffffffaf8;
  OSQPData *in_stack_fffffffffffffb00;
  basic_string_view<char,_std::char_traits<char>_> local_3f0;
  basic_string_view<char,_std::char_traits<char>_> local_3e0;
  basic_string_view<char,_std::char_traits<char>_> local_3d0;
  basic_string_view<char,_std::char_traits<char>_> local_3c0;
  basic_string_view<char,_std::char_traits<char>_> local_3b0;
  basic_string_view<char,_std::char_traits<char>_> local_3a0;
  basic_string_view<char,_std::char_traits<char>_> local_390;
  basic_string_view<char,_std::char_traits<char>_> local_380;
  int local_36c;
  pointer pOStack_368;
  int return_code;
  OSQPWorkspace *workspace;
  OSQPSettings osqp_settings;
  csc constraint_matrix;
  csc objective_matrix;
  undefined1 local_230 [8];
  SparseMatrix<double,_0,_long_long> objective_matrix_upper_triangle;
  OSQPData data;
  CwiseBinaryOp<Eigen::internal::scalar_min_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_1a8;
  undefined1 local_180 [8];
  VectorXd clipped_upper_bounds;
  CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_168;
  undefined1 local_140 [8];
  VectorXd clipped_lower_bounds;
  char *pcStack_128;
  string_view local_120;
  byte local_109;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  string_view local_f8;
  byte local_e1;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  string_view local_d0;
  byte local_b9;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  string_view local_a8;
  byte local_91;
  uint local_90;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  string_view local_70;
  byte local_59;
  c_int local_58;
  c_int num_constraints;
  c_int num_variables;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  OsqpSettings *local_28;
  OsqpSettings *settings_local;
  OsqpInstance *instance_local;
  OsqpSolver *this_local;
  Status *result;
  
  local_28 = in_RCX;
  settings_local = settings;
  instance_local = instance;
  this_local = this;
  bVar2 = Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_0,_long_long>_>::isCompressed
                    ((SparseCompressedBase<Eigen::SparseMatrix<double,_0,_long_long>_> *)settings);
  if (bVar2) {
    bVar2 = Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_0,_long_long>_>::isCompressed
                      ((SparseCompressedBase<Eigen::SparseMatrix<double,_0,_long_long>_> *)
                       &settings_local->eps_dual_inf);
    if (bVar2) {
      num_constraints = OsqpInstance::num_variables((OsqpInstance *)settings_local);
      local_58 = OsqpInstance::num_constraints((OsqpInstance *)settings_local);
      local_59 = 0;
      IVar3 = Eigen::SparseMatrix<double,_0,_long_long>::cols
                        ((SparseMatrix<double,_0,_long_long> *)settings_local);
      iVar1 = (int)num_constraints;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_70,"instance.objective_matrix.cols()");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_80,"num_variables");
      right_name._M_str = local_80._M_str;
      right_name._M_len = local_80._M_len;
      anon_unknown_6::CheckDimensions((anon_unknown_6 *)this,(int)IVar3,iVar1,local_70,right_name);
      bVar2 = absl::Status::ok((Status *)this);
      if (!bVar2) {
        local_59 = 1;
      }
      local_90 = (uint)!bVar2;
      if ((local_59 & 1) == 0) {
        absl::Status::~Status((Status *)this);
      }
      if (local_90 == 0) {
        local_91 = 0;
        IVar3 = Eigen::SparseMatrix<double,_0,_long_long>::rows
                          ((SparseMatrix<double,_0,_long_long> *)settings_local);
        iVar1 = (int)num_constraints;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_a8,"instance.objective_matrix.rows()");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_b8,"num_variables");
        right_name_00._M_str = local_b8._M_str;
        right_name_00._M_len = local_b8._M_len;
        anon_unknown_6::CheckDimensions
                  ((anon_unknown_6 *)this,(int)IVar3,iVar1,local_a8,right_name_00);
        bVar2 = absl::Status::ok((Status *)this);
        if (!bVar2) {
          local_91 = 1;
        }
        local_90 = (uint)!bVar2;
        if ((local_91 & 1) == 0) {
          absl::Status::~Status((Status *)this);
        }
        if (local_90 == 0) {
          local_b9 = 0;
          IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                            ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                             &settings_local->eps_rel);
          iVar1 = (int)num_constraints;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_d0,"instance.objective_vector.size()");
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_e0,"num_variables");
          right_name_01._M_str = local_e0._M_str;
          right_name_01._M_len = local_e0._M_len;
          anon_unknown_6::CheckDimensions
                    ((anon_unknown_6 *)this,(int)IVar4,iVar1,local_d0,right_name_01);
          bVar2 = absl::Status::ok((Status *)this);
          if (!bVar2) {
            local_b9 = 1;
          }
          local_90 = (uint)!bVar2;
          if ((local_b9 & 1) == 0) {
            absl::Status::~Status((Status *)this);
          }
          if (local_90 == 0) {
            local_e1 = 0;
            IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                              ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                               (settings_local + 1));
            iVar1 = (int)local_58;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_f8,"instance.lower_bounds.size()");
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_108,"num_constraints");
            right_name_02._M_str = local_108._M_str;
            right_name_02._M_len = local_108._M_len;
            anon_unknown_6::CheckDimensions
                      ((anon_unknown_6 *)this,(int)IVar4,iVar1,local_f8,right_name_02);
            bVar2 = absl::Status::ok((Status *)this);
            if (!bVar2) {
              local_e1 = 1;
            }
            local_90 = (uint)!bVar2;
            if ((local_e1 & 1) == 0) {
              absl::Status::~Status((Status *)this);
            }
            if (local_90 == 0) {
              local_109 = 0;
              IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                                ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                 &settings_local[1].scaling);
              iVar1 = (int)local_58;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_120,"instance.upper_bounds.size()");
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &clipped_lower_bounds.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows,"num_constraints");
              right_name_03._M_str = pcStack_128;
              right_name_03._M_len =
                   clipped_lower_bounds.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
              anon_unknown_6::CheckDimensions
                        ((anon_unknown_6 *)this,(int)IVar4,iVar1,local_120,right_name_03);
              bVar2 = absl::Status::ok((Status *)this);
              if (!bVar2) {
                local_109 = 1;
              }
              local_90 = (uint)!bVar2;
              if ((local_109 & 1) == 0) {
                absl::Status::~Status((Status *)this);
              }
              if (local_90 == 0) {
                clipped_upper_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows = -0x39d6c1a6c65f7316;
                Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseMax
                          (&local_168,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                           (settings_local + 1),
                           (Scalar *)
                           &clipped_upper_bounds.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                            .m_rows);
                Eigen::Matrix<double,-1,1,0,-1,1>::
                Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,double,0>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>>
                          ((Matrix<double,_1,1,0,_1,1> *)local_140,
                           (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                            *)&local_168);
                data.u = (c_float *)0x46293e5939a08cea;
                Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseMin
                          (&local_1a8,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                           &settings_local[1].scaling,(Scalar *)&data.u);
                Eigen::Matrix<double,-1,1,0,-1,1>::
                Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,double,0>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>>
                          ((Matrix<double,_1,1,0,_1,1> *)local_180,
                           (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                            *)&local_1a8);
                objective_matrix_upper_triangle.m_data.m_allocatedSize = num_constraints;
                data.n = local_58;
                TVar7 = Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>::
                        triangularView<2>((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>
                                           *)settings_local);
                objective_matrix.nz._0_1_ =
                     (bool)TVar7.
                           super_TriangularViewImpl<const_Eigen::SparseMatrix<double,_0,_long_long>,_2U,_Eigen::Sparse>
                           .
                           super_SparseMatrixBase<Eigen::TriangularView<const_Eigen::SparseMatrix<double,_0,_long_long>,_2U>_>
                           .m_isRValue;
                Eigen::SparseMatrix<double,0,long_long>::
                SparseMatrix<Eigen::TriangularView<Eigen::SparseMatrix<double,0,long_long>const,2u>>
                          ((SparseMatrix<double,0,long_long> *)local_230,
                           (SparseMatrixBase<Eigen::TriangularView<const_Eigen::SparseMatrix<double,_0,_long_long>,_2U>_>
                            *)&objective_matrix.nz);
                pSVar5 = Eigen::SparseMatrix<double,_0,_long_long>::outerIndexPtr
                                   ((SparseMatrix<double,_0,_long_long> *)local_230);
                constraint_matrix.nz = pSVar5[num_constraints];
                objective_matrix.nzmax = num_constraints;
                objective_matrix.m = num_constraints;
                objective_matrix.n =
                     (c_int)Eigen::SparseMatrix<double,_0,_long_long>::outerIndexPtr
                                      ((SparseMatrix<double,_0,_long_long> *)local_230);
                objective_matrix.p =
                     Eigen::SparseMatrix<double,_0,_long_long>::innerIndexPtr
                               ((SparseMatrix<double,_0,_long_long> *)local_230);
                objective_matrix.i =
                     (c_int *)Eigen::SparseMatrix<double,_0,_long_long>::valuePtr
                                        ((SparseMatrix<double,_0,_long_long> *)local_230);
                objective_matrix.x = (c_float *)0xffffffffffffffff;
                data.m = (c_int)&constraint_matrix.nz;
                pSVar5 = Eigen::SparseMatrix<double,_0,_long_long>::outerIndexPtr
                                   ((SparseMatrix<double,_0,_long_long> *)
                                    &settings_local->eps_dual_inf);
                osqp_settings.time_limit = (c_float)pSVar5[num_constraints];
                constraint_matrix.nzmax = local_58;
                constraint_matrix.m = num_constraints;
                constraint_matrix.n =
                     (c_int)Eigen::SparseMatrix<double,_0,_long_long>::outerIndexPtr
                                      ((SparseMatrix<double,_0,_long_long> *)
                                       &settings_local->eps_dual_inf);
                constraint_matrix.p =
                     Eigen::SparseMatrix<double,_0,_long_long>::innerIndexPtr
                               ((SparseMatrix<double,_0,_long_long> *)&settings_local->eps_dual_inf)
                ;
                constraint_matrix.i =
                     (c_int *)Eigen::SparseMatrix<double,_0,_long_long>::valuePtr
                                        ((SparseMatrix<double,_0,_long_long> *)
                                         &settings_local->eps_dual_inf);
                constraint_matrix.x = (c_float *)0xffffffffffffffff;
                data.P = (csc *)&osqp_settings.time_limit;
                data.A = (csc *)Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
                                data((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                     &settings_local->eps_rel);
                data.q = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                                   ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                    local_140);
                workp = (OSQPWorkspace **)
                        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                   local_180);
                data.l = (c_float *)workp;
                anon_unknown_6::ToInternalSettings((OSQPSettings *)&workspace,local_28);
                pOStack_368 = (pointer)0x0;
                cVar6 = osqp_setup(workp,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
                local_36c = (int)cVar6;
                std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::reset
                          ((unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *)
                           instance,pOStack_368);
                if (local_36c == 0) {
                  absl::OkStatus();
                }
                else {
                  switch(local_36c) {
                  case 1:
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_380,"Unable to initialize OSQP: data validation error.");
                    message_01._M_str = (char *)local_380._M_len;
                    message_01._M_len = (size_t)this;
                    absl::InvalidArgumentError(message_01);
                    break;
                  case 2:
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_390,"Unable to initialize OSQP: invalid settings.");
                    message_02._M_str = (char *)local_390._M_len;
                    message_02._M_len = (size_t)this;
                    absl::InvalidArgumentError(message_02);
                    break;
                  case 3:
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_3a0,"Unable to initialize OSQP: unable to load linear solver."
                              );
                    message_03._M_str = (char *)local_3a0._M_len;
                    message_03._M_len = (size_t)this;
                    absl::UnknownError(message_03);
                    break;
                  case 4:
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_3b0,
                               "Unable to initialize OSQP: unable to initialize linear solver.");
                    message_04._M_str = (char *)local_3b0._M_len;
                    message_04._M_len = (size_t)this;
                    absl::UnknownError(message_04);
                    break;
                  case 5:
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_3c0,
                               "Unable to initialize OSQP: the problem appears non-convex.");
                    message_05._M_str = (char *)local_3c0._M_len;
                    message_05._M_len = (size_t)this;
                    absl::InvalidArgumentError(message_05);
                    break;
                  case 6:
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_3d0,"Unable to initialize OSQP: memory allocation error.");
                    message_06._M_str = (char *)local_3d0._M_len;
                    message_06._M_len = (size_t)this;
                    absl::UnknownError(message_06);
                    break;
                  case 7:
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_3e0,"Unable to initialize OSQP: workspace not initialized.");
                    message_07._M_str = (char *)local_3e0._M_len;
                    message_07._M_len = (size_t)this;
                    absl::UnknownError(message_07);
                    break;
                  default:
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_3f0,"Unable to initialize OSQP: unrecognized error code.");
                    message_08._M_str = (char *)local_3f0._M_len;
                    message_08._M_len = (size_t)this;
                    absl::UnknownError(message_08);
                  }
                }
                local_90 = 1;
                Eigen::SparseMatrix<double,_0,_long_long>::~SparseMatrix
                          ((SparseMatrix<double,_0,_long_long> *)local_230);
                Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                          ((Matrix<double,__1,_1,_0,__1,_1> *)local_180);
                Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                          ((Matrix<double,__1,_1,_0,__1,_1> *)local_140);
              }
            }
          }
        }
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&num_variables,
                 "constraint_matrix must be compressed (call makeCompressed()).");
      message_00._M_str = (char *)num_variables;
      message_00._M_len = (size_t)this;
      absl::InvalidArgumentError(message_00);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"objective_matrix must be compressed (call makeCompressed()).");
    message._M_str = (char *)local_38._M_len;
    message._M_len = (size_t)this;
    absl::InvalidArgumentError(message);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status OsqpSolver::Init(const OsqpInstance& instance,
                              const OsqpSettings& settings) {
  if (!instance.objective_matrix.isCompressed()) {
    return absl::InvalidArgumentError(
        "objective_matrix must be compressed (call makeCompressed()).");
  }
  if (!instance.constraint_matrix.isCompressed()) {
    return absl::InvalidArgumentError(
        "constraint_matrix must be compressed (call makeCompressed()).");
  }
  const c_int num_variables = instance.num_variables();
  const c_int num_constraints = instance.num_constraints();

  OSQP_RETURN_IF_ERROR(
      OSQP_CHECK_DIMENSIONS(instance.objective_matrix.cols(), num_variables));
  OSQP_RETURN_IF_ERROR(
      OSQP_CHECK_DIMENSIONS(instance.objective_matrix.rows(), num_variables));
  OSQP_RETURN_IF_ERROR(
      OSQP_CHECK_DIMENSIONS(instance.objective_vector.size(), num_variables));
  OSQP_RETURN_IF_ERROR(
      OSQP_CHECK_DIMENSIONS(instance.lower_bounds.size(), num_constraints));
  OSQP_RETURN_IF_ERROR(
      OSQP_CHECK_DIMENSIONS(instance.upper_bounds.size(), num_constraints));

  // Clip bounds using OSQP_INFTY. Failing to do this causes subtle convergence
  // issues instead of producing explicit errors (e.g., the
  // DetectsPrimalInfeasible test fails). The osqp-python interface also clips
  // the bounds in the same way.
  VectorXd clipped_lower_bounds = instance.lower_bounds.cwiseMax(-OSQP_INFTY);
  VectorXd clipped_upper_bounds = instance.upper_bounds.cwiseMin(OSQP_INFTY);

  // OSQP copies all the data, so it's okay to discard this struct after
  // osqp_setup. It also does not modify the input data (note osqp_setup takes a
  // const OSQPData*). const_cast is needed here to fill in the input data
  // structures.
  OSQPData data;
  data.n = num_variables;
  data.m = num_constraints;

  // TODO(ml): This copy could be avoided if the matrix is already upper
  // triangular.
  Eigen::SparseMatrix<double, Eigen::ColMajor, c_int>
      objective_matrix_upper_triangle =
          instance.objective_matrix.triangularView<Eigen::Upper>();

  // OSQP's csc struct represents sparse matrices in compressed sparse column
  // (CSC) format and (confusingly) triplet format. osqp_setup() assumes the
  // input is provided in CSC format. The mapping from Eigen::SparseMatrix's
  // outerIndexPtr(), innerIndexPtr(), and valuePtr() is direct because we
  // require the sparse matrices to be compressed and follow the Eigen::ColMajor
  // storage scheme. For further background, see
  // https://eigen.tuxfamily.org/dox/group__TutorialSparse.html for the
  // description of CSC format in Eigen and osqp/include/types.h for the
  // definition of OSQP's csc struct.
  ::csc objective_matrix = {
      objective_matrix_upper_triangle.outerIndexPtr()[num_variables],
      num_variables,
      num_variables,
      const_cast<c_int*>(objective_matrix_upper_triangle.outerIndexPtr()),
      const_cast<c_int*>(objective_matrix_upper_triangle.innerIndexPtr()),
      const_cast<double*>(objective_matrix_upper_triangle.valuePtr()),
      -1};
  data.P = &objective_matrix;

  ::csc constraint_matrix = {
      instance.constraint_matrix.outerIndexPtr()[num_variables],
      num_constraints,
      num_variables,
      const_cast<c_int*>(instance.constraint_matrix.outerIndexPtr()),
      const_cast<c_int*>(instance.constraint_matrix.innerIndexPtr()),
      const_cast<double*>(instance.constraint_matrix.valuePtr()),
      -1};
  data.A = &constraint_matrix;

  data.q = const_cast<double*>(instance.objective_vector.data());
  data.l = clipped_lower_bounds.data();
  data.u = clipped_upper_bounds.data();

  ::OSQPSettings osqp_settings = ToInternalSettings(settings);

  OSQPWorkspace* workspace = nullptr;
  const int return_code = osqp_setup(&workspace, &data, &osqp_settings);
  workspace_.reset(static_cast<OSQPWorkspaceHelper*>(workspace));
  if (return_code == 0) {
    return absl::OkStatus();
  }
  switch (static_cast<osqp_error_type>(return_code)) {
    case OSQP_DATA_VALIDATION_ERROR:
      return absl::InvalidArgumentError(
          "Unable to initialize OSQP: data validation error.");
    case OSQP_SETTINGS_VALIDATION_ERROR:
      return absl::InvalidArgumentError(
          "Unable to initialize OSQP: invalid settings.");
    case OSQP_LINSYS_SOLVER_LOAD_ERROR:
      // This should never happen because qdldl is statically linked in.
      return absl::UnknownError(
          "Unable to initialize OSQP: unable to load linear solver.");
    case OSQP_LINSYS_SOLVER_INIT_ERROR:
      return absl::UnknownError(
          "Unable to initialize OSQP: unable to initialize linear solver.");
    case OSQP_NONCVX_ERROR:
      return absl::InvalidArgumentError(
          "Unable to initialize OSQP: the problem appears non-convex.");
    case OSQP_MEM_ALLOC_ERROR:
      return absl::UnknownError(
          "Unable to initialize OSQP: memory allocation error.");
    case OSQP_WORKSPACE_NOT_INIT_ERROR:
      return absl::UnknownError(
          "Unable to initialize OSQP: workspace not initialized.");
  }
  return absl::UnknownError(
      "Unable to initialize OSQP: unrecognized error code.");
}